

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O2

int coda_bin_cursor_get_num_elements(coda_cursor *cursor,long *num_elements)

{
  int iVar1;
  char *pcVar2;
  coda_type *pcVar3;
  long lVar4;
  ulong uVar5;
  char *pcStack_50;
  char acStack_48 [24];
  
  pcVar3 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar3->format) {
    pcVar3 = *(coda_type **)&pcVar3->type_class;
  }
  if (1 < pcVar3->type_class) {
    *num_elements = 1;
    return 0;
  }
  pcVar3 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar3->format) {
    pcVar3 = *(coda_type **)&pcVar3->type_class;
  }
  if (pcVar3->type_class == 1) {
    pcVar2 = *(char **)&pcVar3[1].type_class;
    if (pcVar2 == (char *)0xffffffffffffffff) {
      lVar4 = 1;
      uVar5 = 0;
      do {
        if ((long)*(int *)&pcVar3[1].name <= (long)uVar5) {
          *num_elements = lVar4;
          return 0;
        }
        pcVar2 = (&pcVar3[1].description)[uVar5];
        if ((&pcVar3[1].description)[uVar5] == (char *)0xffffffffffffffff) {
          iVar1 = coda_expression_eval_integer
                            ((coda_expression *)(&pcVar3[2].bit_size)[uVar5],cursor,
                             (int64_t *)&pcStack_50);
          if (iVar1 != 0) {
            coda_add_error_message(" for dim[%d] expression",uVar5 & 0xffffffff);
LAB_0017b416:
            coda_cursor_add_to_error_message(cursor);
            return -1;
          }
          pcVar2 = pcStack_50;
          if ((long)pcStack_50 < 0) {
            coda_str64((int64_t)pcStack_50,acStack_48);
            coda_set_error(-300,
                           "product error detected (invalid array size - calculated array size = %s)"
                           ,acStack_48);
            goto LAB_0017b416;
          }
        }
        lVar4 = lVar4 * (long)pcVar2;
        uVar5 = uVar5 + 1;
      } while( true );
    }
  }
  else {
    if (pcVar3->type_class != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                    ,0x343,"int coda_ascbin_cursor_get_num_elements(const coda_cursor *, long *)");
    }
    pcVar2 = pcVar3[1].name;
  }
  *num_elements = (long)pcVar2;
  return 0;
}

Assistant:

int coda_bin_cursor_get_num_elements(const coda_cursor *cursor, long *num_elements)
{
    switch (coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type)->type_class)
    {
        case coda_array_class:
        case coda_record_class:
            return coda_ascbin_cursor_get_num_elements(cursor, num_elements);
        default:
            *num_elements = 1;  /* non-compound types type */
            break;
    }

    return 0;
}